

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

bool __thiscall QTextUndoCommand::tryMerge(QTextUndoCommand *this,QTextUndoCommand *other)

{
  int iVar1;
  undefined1 uVar2;
  quint8 qVar3;
  int iVar4;
  quint32 qVar5;
  undefined4 uVar6;
  int l;
  QTextUndoCommand *other_local;
  QTextUndoCommand *this_local;
  bool local_1;
  
  if (this->command == other->command) {
    if ((((this->command == 0) && (this->pos + (this->field_8).blockFormat == other->pos)) &&
        (this->strPos + (this->field_8).blockFormat == other->strPos)) &&
       (this->format == other->format)) {
      (this->field_8).blockFormat = (other->field_8).blockFormat + (this->field_8).blockFormat;
      local_1 = true;
    }
    else if (((this->command == 1) && (this->pos == other->pos)) &&
            ((this->strPos + (this->field_8).blockFormat == other->strPos &&
             (this->format == other->format)))) {
      (this->field_8).blockFormat = (other->field_8).blockFormat + (this->field_8).blockFormat;
      local_1 = true;
    }
    else if (((this->command == 1) && (other->pos + (other->field_8).blockFormat == this->pos)) &&
            ((other->strPos + (other->field_8).blockFormat == this->strPos &&
             (this->format == other->format)))) {
      iVar1 = (this->field_8).blockFormat;
      uVar2 = other->field_0x2;
      qVar3 = other->operation;
      iVar4 = other->format;
      this->command = other->command;
      this->field_0x2 = uVar2;
      this->operation = qVar3;
      this->format = iVar4;
      qVar5 = other->pos;
      this->strPos = other->strPos;
      this->pos = qVar5;
      this->field_8 = other->field_8;
      uVar6 = *(undefined4 *)&other->field_0x1c;
      this->revision = other->revision;
      *(undefined4 *)&this->field_0x1c = uVar6;
      (this->field_8).blockFormat = iVar1 + (this->field_8).blockFormat;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool QTextUndoCommand::tryMerge(const QTextUndoCommand &other)
{
    if (command != other.command)
        return false;

    if (command == Inserted
        && (pos + length == other.pos)
        && (strPos + length == other.strPos)
        && format == other.format) {

        length += other.length;
        return true;
    }

    // removal to the 'right' using 'Delete' key
    if (command == Removed
        && pos == other.pos
        && (strPos + length == other.strPos)
        && format == other.format) {

        length += other.length;
        return true;
    }

    // removal to the 'left' using 'Backspace'
    if (command == Removed
        && (other.pos + other.length == pos)
        && (other.strPos + other.length == strPos)
        && (format == other.format)) {

        int l = length;
        (*this) = other;

        length += l;
        return true;
    }

    return false;
}